

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O0

int __thiscall
cppcms::applications_pool::mount
          (applications_pool *this,char *__special_file,char *__dir,char *__fstype,ulong __rwflag,
          void *__data)

{
  bool bVar1;
  int extraout_EAX;
  undefined8 uVar2;
  _data *this_00;
  iterator it;
  unique_lock<std::recursive_mutex> lock;
  string *in_stack_fffffffffffffea8;
  application_specific_pool *in_stack_fffffffffffffeb0;
  value_type *__x;
  _data *this_01;
  int in_stack_ffffffffffffff3c;
  application_specific_pool *in_stack_ffffffffffffff40;
  allocator local_99;
  string local_98 [32];
  _Self local_78;
  _Self local_70 [3];
  undefined1 local_55;
  allocator local_41;
  string local_40 [36];
  uint local_1c;
  char *local_18;
  char *local_10;
  applications_pool *local_8;
  
  local_1c = (uint)__fstype;
  local_18 = __dir;
  local_10 = __special_file;
  local_8 = this;
  if (((ulong)__fstype & 0x8000) != 0) {
    local_55 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,"Direct specification of cppcms::app::legacy flag is forbidden",&local_41);
    cppcms_error::cppcms_error((cppcms_error *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    local_55 = 0;
    __cxa_throw(uVar2,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
  }
  std::
  __shared_ptr_access<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x3aa903);
  booster::hold_ptr<cppcms::applications_pool::_data>::operator->(&this->d);
  application_specific_pool::size(in_stack_fffffffffffffeb0,(size_t)in_stack_fffffffffffffea8);
  std::
  __shared_ptr_access<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x3aa92e);
  application_specific_pool::flags(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  if ((local_1c & 0x20) != 0) {
    std::
    __shared_ptr_access<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3aa956);
    application_specific_pool::prepopulate
              (in_stack_fffffffffffffeb0,(service *)in_stack_fffffffffffffea8);
  }
  booster::hold_ptr<cppcms::applications_pool::_data>::operator->(&this->d);
  std::unique_lock<std::recursive_mutex>::unique_lock
            ((unique_lock<std::recursive_mutex> *)in_stack_fffffffffffffeb0,
             (mutex_type *)in_stack_fffffffffffffea8);
  booster::hold_ptr<cppcms::applications_pool::_data>::operator->(&this->d);
  local_70[0]._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
       ::begin((list<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
                *)in_stack_fffffffffffffea8);
  while( true ) {
    booster::hold_ptr<cppcms::applications_pool::_data>::operator->(&this->d);
    local_78._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
         ::end((list<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
                *)in_stack_fffffffffffffea8);
    bVar1 = std::operator!=(local_70,&local_78);
    if (!bVar1) {
      this_00 = booster::hold_ptr<cppcms::applications_pool::_data>::operator->(&this->d);
      __x = (value_type *)&stack0xffffffffffffff18;
      this_01 = this_00;
      std::shared_ptr<cppcms::application_specific_pool>::shared_ptr
                ((shared_ptr<cppcms::application_specific_pool> *)this_00,
                 (shared_ptr<cppcms::application_specific_pool> *)in_stack_fffffffffffffea8);
      _data::attachment::attachment
                ((attachment *)this_01,(shared_ptr<cppcms::application_specific_pool> *)__x,
                 (mount_point *)this_00);
      std::__cxx11::
      list<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
      ::push_back(&this_01->apps,__x);
      _data::attachment::~attachment((attachment *)this_00);
      std::shared_ptr<cppcms::application_specific_pool>::~shared_ptr
                ((shared_ptr<cppcms::application_specific_pool> *)0x3aab9f);
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)this_00);
      return extraout_EAX;
    }
    std::_List_iterator<cppcms::applications_pool::_data::attachment>::operator->
              ((_List_iterator<cppcms::applications_pool::_data::attachment> *)0x3aaa02);
    bVar1 = std::operator==((shared_ptr<cppcms::application_specific_pool> *)
                            in_stack_fffffffffffffeb0,
                            (shared_ptr<cppcms::application_specific_pool> *)
                            in_stack_fffffffffffffea8);
    if (bVar1) break;
    std::_List_iterator<cppcms::applications_pool::_data::attachment>::operator++(local_70);
  }
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_98,"Attempt to mount application_specific_pool twice",&local_99);
  cppcms_error::cppcms_error((cppcms_error *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  __cxa_throw(uVar2,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
}

Assistant:

void applications_pool::mount(booster::shared_ptr<application_specific_pool> gen,mount_point const &point,int flags)
{
	if(flags & app::legacy) {
		throw cppcms_error("Direct specification of cppcms::app::legacy flag is forbidden");
	}
	gen->size(d->thread_count);
	gen->flags(flags);
	if(flags & app::prepopulated)
		gen->prepopulate(*srv_);
	booster::unique_lock<booster::recursive_mutex> lock(d->lock);
	for(std::list<_data::attachment>::iterator it = d->apps.begin();it!=d->apps.end();++it) {
		if(it->pool == gen)
			throw cppcms_error("Attempt to mount application_specific_pool twice");
	}
	d->apps.push_back(_data::attachment(gen,point));
}